

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiColumns::ImGuiColumns(ImGuiColumns *this)

{
  long in_RDI;
  ImDrawListSplitter *this_00;
  ImRect *in_stack_ffffffffffffffd0;
  
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  this_00 = (ImDrawListSplitter *)(in_RDI + 0x60);
  ImVector<ImGuiColumnData>::ImVector((ImVector<ImGuiColumnData> *)this_00);
  ImDrawListSplitter::ImDrawListSplitter(this_00);
  Clear((ImGuiColumns *)0x2e6f1a);
  return;
}

Assistant:

ImGuiColumns()      { Clear(); }